

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void double_jacobian_default
               (tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *Z1,tc_uECC_Curve curve)

{
  tc_uECC_word_t *mod;
  tc_uECC_word_t *ptVar1;
  char num_words;
  wordcount_t i_1;
  long lVar2;
  tc_uECC_word_t *ptVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  tc_uECC_word_t *end;
  long lVar7;
  tc_uECC_word_t local_c8 [2];
  tc_uECC_word_t t4 [8];
  tc_uECC_word_t t5 [8];
  tc_uECC_word_t product [16];
  
  num_words = curve->num_words;
  lVar7 = (long)num_words;
  if (0 < lVar7) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | Z1[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar7 != lVar2);
    if (uVar4 != 0) {
      tc_uECC_vli_mult(t5 + 6,Y1,Y1,num_words);
      (*curve->mmod_fast)(local_c8,t5 + 6);
      tc_uECC_vli_mult(t5 + 6,X1,local_c8,curve->num_words);
      (*curve->mmod_fast)(t4 + 6,t5 + 6);
      tc_uECC_vli_mult(t5 + 6,local_c8,local_c8,curve->num_words);
      (*curve->mmod_fast)(local_c8,t5 + 6);
      tc_uECC_vli_mult(t5 + 6,Y1,Z1,curve->num_words);
      (*curve->mmod_fast)(Y1,t5 + 6);
      tc_uECC_vli_mult(t5 + 6,Z1,Z1,curve->num_words);
      (*curve->mmod_fast)(Z1,t5 + 6);
      mod = curve->p;
      tc_uECC_vli_modAdd(X1,X1,Z1,mod,num_words);
      tc_uECC_vli_modAdd(Z1,Z1,Z1,mod,num_words);
      tc_uECC_vli_modSub(Z1,X1,Z1,mod,num_words);
      tc_uECC_vli_mult(t5 + 6,X1,Z1,curve->num_words);
      (*curve->mmod_fast)(X1,t5 + 6);
      tc_uECC_vli_modAdd(Z1,X1,X1,mod,num_words);
      tc_uECC_vli_modAdd(X1,X1,Z1,mod,num_words);
      if ((*X1 & 1) == 0) {
        ptVar3 = X1 + lVar7;
        uVar4 = 0;
        do {
          uVar5 = ptVar3[-1];
          ptVar3[-1] = uVar5 >> 1 | uVar4;
          ptVar3 = ptVar3 + -1;
          uVar4 = uVar5 << 0x1f;
        } while (X1 < ptVar3);
      }
      else {
        lVar2 = 0;
        uVar4 = 0;
        do {
          uVar5 = X1[lVar2];
          uVar6 = uVar5 + uVar4 + mod[lVar2];
          if (uVar6 != uVar5) {
            uVar4 = 0;
          }
          uVar4 = uVar4 | uVar6 < uVar5;
          X1[lVar2] = uVar6;
          lVar2 = lVar2 + 1;
        } while (lVar7 != lVar2);
        ptVar1 = X1 + lVar7;
        uVar5 = 0;
        ptVar3 = ptVar1;
        do {
          uVar6 = ptVar3[-1];
          ptVar3[-1] = uVar6 >> 1 | uVar5;
          ptVar3 = ptVar3 + -1;
          uVar5 = uVar6 << 0x1f;
        } while (X1 < ptVar3);
        ptVar1[-1] = ptVar1[-1] | uVar4 << 0x1f;
      }
      tc_uECC_vli_mult(t5 + 6,X1,X1,curve->num_words);
      (*curve->mmod_fast)(Z1,t5 + 6);
      tc_uECC_vli_modSub(Z1,Z1,t4 + 6,mod,num_words);
      tc_uECC_vli_modSub(Z1,Z1,t4 + 6,mod,num_words);
      tc_uECC_vli_modSub(t4 + 6,t4 + 6,Z1,mod,num_words);
      tc_uECC_vli_mult(t5 + 6,X1,t4 + 6,curve->num_words);
      (*curve->mmod_fast)(X1,t5 + 6);
      tc_uECC_vli_modSub(local_c8,X1,local_c8,mod,num_words);
      lVar2 = 0;
      do {
        X1[lVar2] = Z1[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar7 != lVar2);
      lVar2 = 0;
      do {
        Z1[lVar2] = Y1[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar7 != lVar2);
      memcpy(Y1,local_c8,lVar7 << 2);
    }
  }
  return;
}

Assistant:

void double_jacobian_default(tc_uECC_word_t * X1, tc_uECC_word_t * Y1,
			     tc_uECC_word_t * Z1, tc_uECC_Curve curve)
{
	/* t1 = X, t2 = Y, t3 = Z */
	tc_uECC_word_t t4[NUM_ECC_WORDS];
	tc_uECC_word_t t5[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	if (tc_uECC_vli_isZero(Z1, num_words)) {
		return;
	}

	tc_uECC_vli_modSquare_fast(t4, Y1, curve);   /* t4 = y1^2 */
	tc_uECC_vli_modMult_fast(t5, X1, t4, curve); /* t5 = x1*y1^2 = A */
	tc_uECC_vli_modSquare_fast(t4, t4, curve);   /* t4 = y1^4 */
	tc_uECC_vli_modMult_fast(Y1, Y1, Z1, curve); /* t2 = y1*z1 = z3 */
	tc_uECC_vli_modSquare_fast(Z1, Z1, curve);   /* t3 = z1^2 */

	tc_uECC_vli_modAdd(X1, X1, Z1, curve->p, num_words); /* t1 = x1 + z1^2 */
	tc_uECC_vli_modAdd(Z1, Z1, Z1, curve->p, num_words); /* t3 = 2*z1^2 */
	tc_uECC_vli_modSub(Z1, X1, Z1, curve->p, num_words); /* t3 = x1 - z1^2 */
	tc_uECC_vli_modMult_fast(X1, X1, Z1, curve); /* t1 = x1^2 - z1^4 */

	tc_uECC_vli_modAdd(Z1, X1, X1, curve->p, num_words); /* t3 = 2*(x1^2 - z1^4) */
	tc_uECC_vli_modAdd(X1, X1, Z1, curve->p, num_words); /* t1 = 3*(x1^2 - z1^4) */
	if (tc_uECC_vli_testBit(X1, 0)) {
		tc_uECC_word_t l_carry = tc_uECC_vli_add(X1, X1, curve->p, num_words);
		tc_uECC_vli_rshift1(X1, num_words);
		X1[num_words - 1] |= l_carry << (tc_uECC_WORD_BITS - 1);
	} else {
		tc_uECC_vli_rshift1(X1, num_words);
	}

	/* t1 = 3/2*(x1^2 - z1^4) = B */
	tc_uECC_vli_modSquare_fast(Z1, X1, curve); /* t3 = B^2 */
	tc_uECC_vli_modSub(Z1, Z1, t5, curve->p, num_words); /* t3 = B^2 - A */
	tc_uECC_vli_modSub(Z1, Z1, t5, curve->p, num_words); /* t3 = B^2 - 2A = x3 */
	tc_uECC_vli_modSub(t5, t5, Z1, curve->p, num_words); /* t5 = A - x3 */
	tc_uECC_vli_modMult_fast(X1, X1, t5, curve); /* t1 = B * (A - x3) */
	/* t4 = B * (A - x3) - y1^4 = y3: */
	tc_uECC_vli_modSub(t4, X1, t4, curve->p, num_words);

	tc_uECC_vli_set(X1, Z1, num_words);
	tc_uECC_vli_set(Z1, Y1, num_words);
	tc_uECC_vli_set(Y1, t4, num_words);
}